

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  size_t sStack_58;
  int rc;
  void *ptr [2];
  undefined8 local_40;
  size_t offv;
  size_t length;
  size_t *off_local;
  size_t size_local;
  char *buf_local;
  tnt_reply *r_local;
  
  length = (size_t)off;
  off_local = (size_t *)size;
  size_local = (size_t)buf;
  buf_local = (char *)r;
  iVar1 = tnt_reply_len(buf,size,&offv);
  if (iVar1 == 0) {
    if (buf_local == (char *)0x0) {
      if (length != 0) {
        *(size_t *)length = offv;
      }
      r_local._4_4_ = 0;
    }
    else {
      local_40 = 0;
      sStack_58 = size_local;
      ptr[0] = &local_40;
      r_local._4_4_ = tnt_reply_from((tnt_reply *)buf_local,tnt_reply_cb,&stack0xffffffffffffffa8);
      if (length != 0) {
        *(undefined8 *)length = local_40;
      }
    }
  }
  else if (iVar1 == 1) {
    if (length != 0) {
      *(size_t *)length = offv;
    }
    r_local._4_4_ = 1;
  }
  else {
    r_local._4_4_ = -1;
  }
  return r_local._4_4_;
}

Assistant:

int
tnt_reply(struct tnt_reply *r, char *buf, size_t size, size_t *off) {
	/* supplied buffer must contain full reply,
	 * if it doesn't then returning count of bytes
	 * needed to process */
	size_t length;
	switch (tnt_reply_len(buf, size, &length)) {
	case 0:
		break;
	case 1:
		if (off)
			*off = length;
		return 1;
	default:
		return -1;
	}
	if (r == NULL) {
		if (off)
			*off = length;
		return 0;
	}
	size_t offv = 0;
	void *ptr[2] = { buf, &offv };
	int rc = tnt_reply_from(r, (tnt_reply_t)tnt_reply_cb, ptr);
	if (off)
		*off = offv;
	return rc;
}